

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelDiscreteInterface.h
# Opt level: O1

void __thiscall RewardModelDiscreteInterface::Print(RewardModelDiscreteInterface *this)

{
  long *local_28;
  long local_20;
  long local_18 [2];
  
  (*(this->super_QTableInterface)._vptr_QTableInterface[5])(&local_28,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_28,local_20);
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  return;
}

Assistant:

void Print() const
        { std::cout << SoftPrint();}